

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# budCovPlatform.cpp
# Opt level: O3

void __thiscall cov::Platform::~Platform(Platform *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  if (this->m_vkInstance != (VkInstance)0x0) {
    vkDestroyInstance(this->m_vkInstance,0);
  }
  pcVar1 = (this->m_extensions)._M_dataplus._M_p;
  paVar2 = &(this->m_extensions).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->m_vendor)._M_dataplus._M_p;
  paVar2 = &(this->m_vendor).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->m_name)._M_dataplus._M_p;
  paVar2 = &(this->m_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->m_version)._M_dataplus._M_p;
  paVar2 = &(this->m_version).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->m_profile)._M_dataplus._M_p;
  paVar2 = &(this->m_profile).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

Platform::~Platform()
{
    if (m_vkInstance != VK_NULL_HANDLE) vkDestroyInstance(m_vkInstance, nullptr);
}